

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t psa_finish_key_creation(psa_key_slot_t *slot,psa_se_drv_table_entry_t *driver)

{
  ushort uVar1;
  uint uVar2;
  psa_status_t pVar3;
  uint8_t *data;
  ulong __size;
  size_t length;
  
  if ((slot->attr).lifetime == 0) {
    return 0;
  }
  uVar1 = (slot->attr).type;
  if (((uVar1 & 0x7000) != 0x2000) && ((uVar1 & 0x7000) != 0x1000)) {
    if (uVar1 == 0x4001) {
      uVar2 = ((slot->attr).bits >> 3) + 0x10;
      goto LAB_00126c9f;
    }
    if (uVar1 == 0x4002) {
      uVar2 = (uint)((slot->attr).bits >> 3) * 3 + 0x4a;
      goto LAB_00126c9f;
    }
    if (uVar1 == 0x7002) {
      uVar2 = (uint)((slot->attr).bits >> 3) * 3 + 0x5a;
      goto LAB_00126c9f;
    }
    if (uVar1 == 0x7001) {
      uVar2 = (((slot->attr).bits >> 1) + 1 >> 3) * 9 + 0x3b;
      goto LAB_00126c9f;
    }
    if ((uVar1 & 0xff00) == 0x4100) {
      uVar2 = (slot->attr).bits + 7 >> 2 | 1;
      goto LAB_00126c9f;
    }
    uVar2 = 0;
    if ((uVar1 & 0xff00) != 0x7100) goto LAB_00126c9f;
  }
  uVar2 = (slot->attr).bits + 7 >> 3;
LAB_00126c9f:
  __size = (ulong)uVar2;
  data = (uint8_t *)calloc(1,__size);
  length = 0;
  if (data == (uint8_t *)0x0) {
    pVar3 = -0x8d;
  }
  else {
    pVar3 = psa_internal_export_key(slot,data,__size,&length,0);
    if (pVar3 == 0) {
      pVar3 = psa_save_persistent_key(&slot->attr,data,length);
    }
    mbedtls_platform_zeroize(data,__size);
    free(data);
  }
  return pVar3;
}

Assistant:

static psa_status_t psa_finish_key_creation(
    psa_key_slot_t *slot,
    psa_se_drv_table_entry_t *driver )
{
    psa_status_t status = PSA_SUCCESS;
    (void) slot;
    (void) driver;

#if defined(MBEDTLS_PSA_CRYPTO_STORAGE_C)
    if( slot->attr.lifetime != PSA_KEY_LIFETIME_VOLATILE )
    {
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
        if( driver != NULL )
        {
            psa_se_key_data_storage_t data;
#if defined(static_assert)
            static_assert( sizeof( slot->data.se.slot_number ) ==
                           sizeof( data.slot_number ),
                           "Slot number size does not match psa_se_key_data_storage_t" );
            static_assert( sizeof( slot->attr.bits ) == sizeof( data.bits ),
                           "Bit-size size does not match psa_se_key_data_storage_t" );
#endif
            memcpy( &data.slot_number, &slot->data.se.slot_number,
                    sizeof( slot->data.se.slot_number ) );
            memcpy( &data.bits, &slot->attr.bits,
                    sizeof( slot->attr.bits ) );
            status = psa_save_persistent_key( &slot->attr,
                                              (uint8_t*) &data,
                                              sizeof( data ) );
        }
        else
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
        {
            size_t buffer_size =
                PSA_KEY_EXPORT_MAX_SIZE( slot->attr.type,
                                         slot->attr.bits );
            uint8_t *buffer = mbedtls_calloc( 1, buffer_size );
            size_t length = 0;
            if( buffer == NULL )
                return( PSA_ERROR_INSUFFICIENT_MEMORY );
            status = psa_internal_export_key( slot,
                                              buffer, buffer_size, &length,
                                              0 );
            if( status == PSA_SUCCESS )
                status = psa_save_persistent_key( &slot->attr,
                                                  buffer, length );

            mbedtls_platform_zeroize( buffer, buffer_size );
            mbedtls_free( buffer );
        }
    }
#endif /* defined(MBEDTLS_PSA_CRYPTO_STORAGE_C) */

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    /* Finish the transaction for a key creation. This does not
     * happen when registering an existing key. Detect this case
     * by checking whether a transaction is in progress (actual
     * creation of a key in a secure element requires a transaction,
     * but registration doesn't use one). */
    if( driver != NULL &&
        psa_crypto_transaction.unknown.type == PSA_CRYPTO_TRANSACTION_CREATE_KEY )
    {
        status = psa_save_se_persistent_data( driver );
        if( status != PSA_SUCCESS )
        {
            psa_destroy_persistent_key( slot->attr.id );
            return( status );
        }
        status = psa_crypto_stop_transaction( );
        if( status != PSA_SUCCESS )
            return( status );
    }
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    return( status );
}